

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gateway.cc
# Opt level: O0

future<int> __thiscall prometheus::Gateway::AsyncDeleteForInstance(Gateway *this)

{
  future<int> fVar1;
  Gateway *this_local;
  
  fVar1 = ::std::async<prometheus::Gateway::AsyncDeleteForInstance()::__0>((launch)this,(type *)0x1)
  ;
  fVar1.super___basic_future<int>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (future<int>)
         fVar1.super___basic_future<int>._M_state.
         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::future<int> Gateway::AsyncDeleteForInstance() {
  return std::async(std::launch::async, [&] { return DeleteForInstance(); });
}